

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraintsValue)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  Index size;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  ulong uVar12;
  _Rb_tree_header *p_Var13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ostringstream errorMsg;
  string local_1e0;
  double local_1c0;
  VectorDynSize *local_1b8;
  VectorDynSize *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = time;
  local_1b8 = state;
  local_1b0 = control;
  uVar6 = iDynTree::VectorDynSize::size();
  uVar5 = getConstraintsDimension(this);
  if (uVar6 != uVar5) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)constraintsValue);
  }
  lVar7 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  p_Var10 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var13) {
    lVar16 = 0;
    do {
      bVar4 = ConstraintsGroup::evaluateConstraints
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var10 + 2),local_1c0,local_1b8,
                         local_1b0,(VectorDynSize *)(*(undefined8 **)(p_Var10 + 2) + 2));
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error while evaluating constraint ",0x22);
        ConstraintsGroup::name_abi_cxx11_
                  (&local_1e0,(ConstraintsGroup *)**(undefined8 **)(p_Var10 + 2));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,
                             local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsEvaluation",local_1e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      lVar8 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar9 = iDynTree::VectorDynSize::size();
      uVar6 = lVar7 + lVar16 * 8;
      uVar12 = uVar9;
      if (((uVar6 & 7) == 0) &&
         (uVar12 = (ulong)((uint)(uVar6 >> 3) & 1), (long)uVar9 <= (long)uVar12)) {
        uVar12 = uVar9;
      }
      if (0 < (long)uVar12) {
        uVar14 = 0;
        do {
          *(undefined8 *)(uVar6 + uVar14 * 8) = *(undefined8 *)(lVar8 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      lVar15 = uVar9 - uVar12;
      uVar14 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar15) {
        do {
          puVar2 = (undefined8 *)(lVar8 + uVar12 * 8);
          uVar3 = puVar2[1];
          puVar1 = (undefined8 *)(uVar6 + uVar12 * 8);
          *puVar1 = *puVar2;
          puVar1[1] = uVar3;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar9) {
        do {
          *(undefined8 *)(uVar6 + uVar14 * 8) = *(undefined8 *)(lVar8 + uVar14 * 8);
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      lVar8 = iDynTree::VectorDynSize::size();
      lVar16 = lVar16 + lVar8;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var13);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::constraintsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraintsValue)
        {
            if (constraintsValue.size() != getConstraintsDimension()) {
                constraintsValue.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > constraintsEvaluation = toEigen(constraintsValue);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->evaluateConstraints(time, state, control, group.second->constraintsBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsEvaluation", errorMsg.str().c_str());
                    return false;
                }

                constraintsEvaluation.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }